

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdDot<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_28.v128_.v = (v128)Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  do {
    *(short *)((long)&local_18 + lVar1 * 2) =
         (short)*(char *)((long)&local_28 + lVar1 * 2 + 1) *
         (short)*(char *)((long)&local_38 + lVar1 * 2 + 1) +
         (short)*(char *)((long)&local_28 + lVar1 * 2) *
         (short)*(char *)((long)&local_38 + lVar1 * 2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  Push(this,(Value)local_18.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDot() {
  using SL = typename S::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx] * rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1] * rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
  }
  Push(result);
  return RunResult::Ok;
}